

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O0

void io::save<double>(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *data,string *file_name)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ostream *poVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  uint local_22c;
  uint local_228;
  uint j;
  uint i;
  long local_218;
  ofstream file;
  string *file_name_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *data_local;
  
  std::ofstream::ofstream(&local_218);
  _Var2 = std::__cxx11::string::c_str();
  std::ofstream::open((char *)&local_218,_Var2);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"file \"");
    poVar3 = std::operator<<(poVar3,(string *)file_name);
    poVar3 = std::operator<<(poVar3,"\" not found");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  std::ios_base::precision((ios_base *)((long)&local_218 + *(long *)(local_218 + -0x18)),0x10);
  local_228 = 0;
  while( true ) {
    sVar4 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(data);
    if (sVar4 <= local_228) break;
    local_22c = 0;
    while( true ) {
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](data,(ulong)local_228);
      sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar5);
      if (sVar4 <= local_22c) break;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](data,(ulong)local_228);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(ulong)local_22c);
      std::ostream::operator<<((ostream *)&local_218,*pvVar6);
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](data,(ulong)local_22c);
      sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar5);
      if ((ulong)local_22c != sVar4 - 1) {
        std::operator<<((ostream *)&local_218," ");
      }
      local_22c = local_22c + 1;
    }
    std::ostream::operator<<((ostream *)&local_218,std::endl<char,std::char_traits<char>>);
    local_228 = local_228 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&local_218);
  return;
}

Assistant:

void save(std::vector<std::vector<T> > const& data, std::string file_name) {
        std::ofstream file;
        file.open(file_name.c_str());
        if(!file.is_open())
        {
            std::cout << "file \"" << file_name << "\" not found" << std::endl;
            exit(1);
        }

        file.precision(std::numeric_limits<T>::digits10 + 1);
        for(unsigned int i = 0; i < data.size(); i++)
        {
            for(unsigned int j = 0; j < data[i].size(); j++)
            {
                file << data[i][j];
                if (j != data[j].size() - 1)
                    file << " ";
            }
            file << std::endl;
        }
        file.close();
    }